

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

bool __thiscall cppcms::widgets::regex_field::validate(regex_field *this)

{
  undefined1 *this_00;
  uint uVar1;
  _func_int *p_Var2;
  bool bVar3;
  string local_40;
  
  this_00 = &(this->super_text).super_base_html_input.field_0x30;
  bVar3 = base_text::validate((base_text *)this_00);
  if (bVar3) {
    p_Var2 = (this->super_text).super_base_html_input._vptr_base_html_input[-3];
    uVar1 = *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2);
    if ((uVar1 & 2) == 0) {
      *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2) =
           uVar1 & 0xfffffffc;
    }
    else {
      base_text::value_abi_cxx11_(&local_40,(base_text *)this_00);
      bVar3 = booster::regex_match<booster::regex>
                        (&local_40,(regex *)&(this->super_text).super_base_html_input.field_0x88,0);
      *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2) =
           *(uint *)(&(this->super_text).super_base_html_input.field_0x1f0 + (long)p_Var2) &
           0xfffffffe | (uint)bVar3;
      std::__cxx11::string::~string((string *)&local_40);
    }
    bVar3 = (bool)((&(this->super_text).super_base_html_input.field_0x1f0)
                   [(long)(this->super_text).super_base_html_input._vptr_base_html_input[-3]] & 1);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool regex_field::validate()
{
	if(!text::validate())
		return false;
	valid(set() && booster::regex_match(value(),expression_));
	return valid();
}